

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O2

int fits_write_keys_histoe
              (fitsfile *fptr,fitsfile *histptr,int naxis,int *colnum,char (*colname) [71],
              char **colexpr,int *status)

{
  fitsfile *fptr_00;
  int *piVar1;
  int iVar2;
  ulong uVar3;
  char (*value) [71];
  ulong uVar4;
  int local_11c;
  fitsfile *local_118;
  undefined8 local_110;
  char (*local_108) [71];
  fitsfile *local_100;
  int *local_f8;
  char **local_f0;
  ulong local_e8;
  ulong local_e0;
  char svalue [71];
  char keyname [75];
  
  iVar2 = *status;
  if (iVar2 < 1) {
    local_e8 = (ulong)(uint)naxis;
    if (naxis < 1) {
      local_e8 = 0;
    }
    uVar4 = 0;
    local_118 = histptr;
    local_108 = colname;
    local_100 = fptr;
    local_f8 = colnum;
    local_f0 = colexpr;
LAB_001b6e64:
    uVar3 = uVar4;
    if (uVar3 != local_e8) {
      local_11c = 0;
      if ((((colexpr == (char **)0x0) || (colexpr[uVar3] == (char *)0x0)) ||
          (local_108 == (char (*) [71])0x0)) || (*colexpr[uVar3] == '\0')) goto LAB_001b6ed6;
      value = local_108 + uVar3;
      ffkeyn("CTYPE",(int)(uVar3 + 1),keyname,&local_11c);
      ffpky(histptr,0x10,keyname,value,"Coordinate Type",&local_11c);
      uVar4 = uVar3 + 1 & 0xffffffff;
      goto LAB_001b700b;
    }
    iVar2 = *status;
  }
  return iVar2;
LAB_001b6ed6:
  uVar4 = uVar3 + 1;
  iVar2 = (int)uVar4;
  ffkeyn("CTYPE",iVar2,keyname,&local_11c);
  ffgky(histptr,0x10,keyname,svalue,(char *)0x0,&local_11c);
  piVar1 = local_f8;
  if (local_11c != 0) {
    local_11c = 0;
    ffkeyn("TTYPE",local_f8[uVar3],keyname,&local_11c);
    fptr_00 = local_100;
    ffgky(local_100,0x10,keyname,svalue,(char *)0x0,&local_11c);
    if (local_11c == 0) {
      ffkeyn("CTYPE",iVar2,keyname,&local_11c);
      ffpky(local_118,0x10,keyname,svalue,"Coordinate Type",&local_11c);
    }
    local_11c = 0;
    ffkeyn("TUNIT",piVar1[uVar3],keyname,&local_11c);
    ffgky(fptr_00,0x10,keyname,svalue,(char *)0x0,&local_11c);
    histptr = local_118;
    if (local_11c == 0) {
      ffkeyn("CUNIT",iVar2,keyname,&local_11c);
      histptr = local_118;
      ffpky(local_118,0x10,keyname,svalue,"Coordinate Units",&local_11c);
    }
LAB_001b700b:
    local_110 = 0x3ff0000000000000;
    local_11c = 0;
    local_e0 = uVar4;
    ffkeyn("CRPIX",(int)uVar4,keyname,&local_11c);
    ffpky(histptr,0x52,keyname,&local_110,"Reference Pixel",&local_11c);
    local_110 = 0x3ff0000000000000;
    local_11c = 0;
    iVar2 = (int)local_e0;
    ffkeyn("CRVAL",iVar2,keyname,&local_11c);
    ffpky(histptr,0x52,keyname,&local_110,"Reference Value",&local_11c);
    local_11c = 0;
    local_110 = 0x3ff0000000000000;
    ffkeyn("CDELT",iVar2,keyname,&local_11c);
    ffpky(histptr,0x52,keyname,&local_110,"Pixel size",&local_11c);
    colexpr = local_f0;
    uVar4 = uVar3 + 1;
  }
  goto LAB_001b6e64;
}

Assistant:

int fits_write_keys_histoe(
      fitsfile *fptr,   /* I - pointer to table to be binned              */
      fitsfile *histptr,  /* I - pointer to output histogram image HDU      */
      int naxis,        /* I - number of axes in the histogram image      */
      int *colnum,      /* I - column numbers (array length = naxis)      */
      char colname[4][FLEN_VALUE], /* I - if expression, then column name to use */
      char *colexpr[4], /* I - if expression, then column name to use */
      int *status)     
{      
   /*  Write default WCS keywords in the output histogram image header */
   /*  if the keywords do not already exist.   */

    int ii, tstatus;
    char keyname[FLEN_KEYWORD], svalue[FLEN_VALUE];
    double dvalue;
    
    if (*status > 0)
        return(*status);

    for (ii = 0; ii < naxis; ii++)
    {
       /*  CTYPEn  */
       tstatus = 0;

       if (colexpr && colexpr[ii] && colexpr[ii][0] && colname[ii]) 
       {
	 /* Column expression: we need to put the column name from the binning expression */
         ffkeyn("CTYPE", ii + 1, keyname, &tstatus);
         ffpky(histptr, TSTRING, keyname, colname[ii], "Coordinate Type", &tstatus);
       }
       else
       {
	 /* Column name */
	 tstatus = 0;
	 ffkeyn("CTYPE", ii+1, keyname, &tstatus);
	 ffgky(histptr, TSTRING, keyname, svalue, NULL, &tstatus);
	 
	 if (!tstatus) continue;  /* keyword already exists, so skip to next axis */

	 /* use column name as the axis name */
	 tstatus = 0;
	 ffkeyn("TTYPE", colnum[ii], keyname, &tstatus);
	 ffgky(fptr, TSTRING, keyname, svalue, NULL, &tstatus);
	 
	 if (!tstatus)
	   {
	     ffkeyn("CTYPE", ii + 1, keyname, &tstatus);
	     ffpky(histptr, TSTRING, keyname, svalue, "Coordinate Type", &tstatus);
	   }
	 
	 /*  CUNITn,  use the column units */
	 tstatus = 0;
	 ffkeyn("TUNIT", colnum[ii], keyname, &tstatus);
	 ffgky(fptr, TSTRING, keyname, svalue, NULL, &tstatus);
	 
	 if (!tstatus)
	   {
	     ffkeyn("CUNIT", ii + 1, keyname, &tstatus);
	     ffpky(histptr, TSTRING, keyname, svalue, "Coordinate Units", &tstatus);
	   }
       }

       /*  CRPIXn  - Reference Pixel choose first pixel in new image as ref. pix. */
       dvalue = 1.0;
       tstatus = 0;
       ffkeyn("CRPIX", ii + 1, keyname, &tstatus);
       ffpky(histptr, TDOUBLE, keyname, &dvalue, "Reference Pixel", &tstatus);

       /*  CRVALn - Value at the location of the reference pixel */
       dvalue = 1.0;
       tstatus = 0;
       ffkeyn("CRVAL", ii + 1, keyname, &tstatus);
       ffpky(histptr, TDOUBLE, keyname, &dvalue, "Reference Value", &tstatus);

       /*  CDELTn - unit size of pixels  */
       dvalue = 1.0;  
       tstatus = 0;
       dvalue = 1.;
       ffkeyn("CDELT", ii + 1, keyname, &tstatus);
       ffpky(histptr, TDOUBLE, keyname, &dvalue, "Pixel size", &tstatus);

    }
    return(*status);
}